

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

bool __thiscall QNetworkProxy::operator==(QNetworkProxy *this,QNetworkProxy *other)

{
  QNetworkProxyPrivate *pQVar1;
  QNetworkProxyPrivate *pQVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar6 = true;
  }
  else {
    if (((pQVar1 != (QNetworkProxyPrivate *)0x0 && pQVar2 != (QNetworkProxyPrivate *)0x0) &&
        (pQVar2->type == pQVar1->type)) && (pQVar2->port == pQVar1->port)) {
      lVar3 = (pQVar2->hostName).d.size;
      lVar4 = (pQVar1->hostName).d.size;
      if ((lVar3 == lVar4) &&
         (QVar7.m_data = (pQVar2->hostName).d.ptr, QVar7.m_size = lVar3,
         QVar10.m_data = (pQVar1->hostName).d.ptr, QVar10.m_size = lVar4,
         cVar5 = QtPrivate::equalStrings(QVar7,QVar10), cVar5 != '\0')) {
        lVar3 = (pQVar2->user).d.size;
        lVar4 = (pQVar1->user).d.size;
        if ((lVar3 == lVar4) &&
           (QVar8.m_data = (pQVar2->user).d.ptr, QVar8.m_size = lVar3,
           QVar11.m_data = (pQVar1->user).d.ptr, QVar11.m_size = lVar4,
           cVar5 = QtPrivate::equalStrings(QVar8,QVar11), cVar5 != '\0')) {
          lVar3 = (pQVar2->password).d.size;
          lVar4 = (pQVar1->password).d.size;
          if ((lVar3 == lVar4) &&
             (QVar9.m_data = (pQVar2->password).d.ptr, QVar9.m_size = lVar3,
             QVar12.m_data = (pQVar1->password).d.ptr, QVar12.m_size = lVar4,
             cVar5 = QtPrivate::equalStrings(QVar9,QVar12), cVar5 != '\0')) {
            return (pQVar2->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
                   super_QFlagsStorage<QNetworkProxy::Capability>.i ==
                   (pQVar1->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
                   super_QFlagsStorage<QNetworkProxy::Capability>.i;
          }
        }
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

constexpr P get() const noexcept { return ptr; }